

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

Am_Object * __thiscall Am_Object::Remove_Slot(Am_Object *this,Am_Slot_Key key)

{
  uint *puVar1;
  Am_Slot_Data *proto_slot;
  Am_Slot slot_00;
  Am_Object_Data *pAVar2;
  uint i;
  Am_Slot_Data *slot;
  Am_Object local_30;
  uint local_24;
  Am_Object_Data *local_20;
  
  if (this->data == (Am_Object_Data *)0x0) {
    Am_Error("** Remove_Slot called on a (0L) object.");
  }
  Am_Object_Data::find_slot_and_position(this->data,key,(Am_Slot_Data **)&local_20,&local_24);
  if (local_20 != (Am_Object_Data *)0x0) {
    local_30.data = local_20;
    am_CList::Invalidate
              ((am_CList *)&local_20->next_instance,(Am_Slot *)&local_30,(Am_Constraint *)0x0,
               (Am_Value *)local_20);
    DynArray::Delete(&this->data->data,local_24);
    if (((ulong)local_20->demon_set & 0x20) == 0) {
      pAVar2 = this->data;
      if (pAVar2->prototype != (Am_Object_Data *)0x0) {
        proto_slot = Am_Object_Data::find_slot(pAVar2->prototype,key);
        pAVar2 = this->data;
        if (proto_slot != (Am_Slot_Data *)0x0) {
          Am_Object_Data::delete_slot(pAVar2,(Am_Slot_Data *)local_20,proto_slot);
          pAVar2 = this->data;
          if ((proto_slot->enabled_demons & pAVar2->prototype->bits_mask) == 0) {
            return this;
          }
          puVar1 = &(pAVar2->super_Am_Wrapper).refs;
          *puVar1 = *puVar1 + 1;
          Am_Object_Advanced::Am_Object_Advanced((Am_Object_Advanced *)&local_30,pAVar2);
          slot_00 = Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&local_30,key);
          ~Am_Object(&local_30);
          Am_Object_Data::enqueue_change(this->data,slot_00.data);
          return this;
        }
      }
      Am_Object_Data::delete_slot(pAVar2,(Am_Slot_Data *)local_20,(Am_Slot_Data *)0x0);
    }
  }
  return this;
}

Assistant:

Am_Object &
Am_Object::Remove_Slot(Am_Slot_Key key)
{
  if (!data)
    Am_Error("** Remove_Slot called on a (0L) object.");
  Am_Slot_Data *slot;
  unsigned i;
  data->find_slot_and_position(key, slot, i);
  if (slot) {
    slot->dependencies.Invalidate(slot, nullptr, *slot);
    data->data.Delete(i);
    if (!(slot->flags & BIT_IS_PART)) {
      Am_Slot_Data *slot_proto = nullptr;
      if (data->prototype)
        slot_proto = data->prototype->find_slot(key);
      if (slot_proto) {
        data->delete_slot(slot, slot_proto);
        if (slot_proto->enabled_demons & data->prototype->bits_mask) {
          data->Note_Reference();
          Am_Slot_Data *new_slot =
              (Am_Slot_Data *)Am_Object_Advanced(data).Get_Slot(key);
          data->enqueue_change(new_slot);
        }
      } else
        data->delete_slot(slot, nullptr);
    }
  }
  return *this;
}